

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsEvaluation
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *constraintsValue)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  _Rb_tree_header *p_Var4;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  ostream *poVar7;
  long lVar8;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> constraintsEvaluation;
  ostringstream errorMsg;
  string local_1e8;
  double local_1c8;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1c0;
  Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>
  local_1a8 [5];
  
  local_1c8 = time;
  uVar3 = iDynTree::VectorDynSize::size();
  uVar2 = getConstraintsDimension(this);
  if (uVar3 != uVar2) {
    getConstraintsDimension(this);
    iDynTree::VectorDynSize::resize((ulong)constraintsValue);
  }
  toEigen(&local_1c0,constraintsValue);
  p_Var6 = (this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header;
  lVar8 = 0;
  do {
    if ((_Rb_tree_header *)p_Var6 == p_Var4) {
LAB_00181093:
      return (_Rb_tree_header *)p_Var6 == p_Var4;
    }
    bVar1 = ConstraintsGroup::evaluateConstraints
                      ((ConstraintsGroup *)**(undefined8 **)(p_Var6 + 2),local_1c8,state,control,
                       (VectorDynSize *)(*(undefined8 **)(p_Var6 + 2) + 2));
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar7 = std::operator<<((ostream *)local_1a8,"Error while evaluating constraint ");
      ConstraintsGroup::name_abi_cxx11_
                (&local_1e8,(ConstraintsGroup *)**(undefined8 **)(p_Var6 + 2));
      poVar7 = std::operator<<(poVar7,(string *)&local_1e8);
      std::operator<<(poVar7,".");
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("OptimalControlProblem","constraintsEvaluation",local_1e8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      goto LAB_00181093;
    }
    toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1e8,
            (VectorDynSize *)(*(long *)(p_Var6 + 2) + 0x10));
    local_1a8[0].
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_0>
    .m_rows.m_value = iDynTree::VectorDynSize::size();
    local_1a8[0].
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_0>
    .m_data = (PointerType)(lVar8 * 8 + local_1c0._0_8_);
    local_1a8[0].
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
    .m_xpr._16_1_ = local_1c0._16_1_;
    local_1a8[0].
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
    .m_xpr._0_8_ = local_1c0._0_8_;
    local_1a8[0].
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
    .m_xpr._8_8_ = local_1c0._8_8_;
    local_1a8[0].
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
    .m_outerStride = local_1c0._8_8_;
    local_1a8[0].
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
    .m_startRow.m_value = lVar8;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
              (local_1a8,
               (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1e8);
    lVar5 = iDynTree::VectorDynSize::size();
    lVar8 = lVar8 + lVar5;
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

bool OptimalControlProblem::constraintsEvaluation(double time, const VectorDynSize &state, const VectorDynSize &control, VectorDynSize &constraintsValue)
        {
            if (constraintsValue.size() != getConstraintsDimension()) {
                constraintsValue.resize(getConstraintsDimension());
            }

            Eigen::Map< Eigen::VectorXd > constraintsEvaluation = toEigen(constraintsValue);
            Eigen::Index offset = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                if (!(group.second->group_ptr->evaluateConstraints(time, state, control, group.second->constraintsBuffer))){
                    std::ostringstream errorMsg;
                    errorMsg << "Error while evaluating constraint " << group.second->group_ptr->name() <<".";
                    reportError("OptimalControlProblem", "constraintsEvaluation", errorMsg.str().c_str());
                    return false;
                }

                constraintsEvaluation.segment(offset, group.second->constraintsBuffer.size()) = toEigen(group.second->constraintsBuffer);
                offset += group.second->constraintsBuffer.size();
            }

            return true;
        }